

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  size_t sVar1;
  ulong uVar2;
  undefined4 in_EAX;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t inlen;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)CONCAT14(type,in_EAX);
  while( true ) {
    uVar2 = uStack_38;
    if (len == 0) {
      return 0;
    }
    inlen = 0x4000;
    if (len < 0x4000) {
      inlen = len;
    }
    uStack_38._4_4_ = SUB84(uVar2,4);
    uStack_38._0_4_ = CONCAT13(3,CONCAT21(0x317,(undefined1)uStack_38));
    iVar3 = ptls_buffer__do_pushv(buf,(void *)((long)&uStack_38 + 1),3);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = ptls_buffer__do_pushv(buf,"",2);
    if (iVar3 != 0) {
      return iVar3;
    }
    sVar1 = buf->off;
    iVar3 = ptls_buffer_reserve(buf,enc->aead->algo->tag_size + inlen + 1);
    if (iVar3 != 0) break;
    sVar4 = aead_encrypt(enc,buf->base + buf->off,src,inlen,(uint8_t)(uStack_38 >> 0x20));
    sVar4 = sVar4 + buf->off;
    buf->off = sVar4;
    lVar5 = sVar4 - sVar1;
    buf->base[sVar1 - 2] = (uint8_t)((ulong)lVar5 >> 8);
    buf->base[sVar1 - 1] = (uint8_t)lVar5;
    src = src + inlen;
    len = len - inlen;
  }
  return iVar3;
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(buf, chunk_size + enc->aead->algo->tag_size + 1)) != 0)
                goto Exit;
            buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
        });
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}